

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_finalize_encoded_frame(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  RefCntBuffer *pRVar1;
  RefCntBuffer *pRVar2;
  uint16_t uVar3;
  int i_1;
  int iVar4;
  uint *puVar5;
  uint16_t uVar6;
  int i;
  long lVar7;
  int tile_col;
  long lVar8;
  int tile_row;
  int iVar9;
  int count [3];
  
  cm = &cpi->common;
  if ((((cpi->common).seq_params)->reduced_still_picture_hdr == '\0') &&
     (iVar4 = encode_show_existing_frame(cm), iVar4 != 0)) {
    pRVar1 = (cpi->common).ref_frame_map[cpi->existing_fb_idx_to_show];
    if (pRVar1 == (RefCntBuffer *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    pRVar2 = (cpi->common).cur_frame;
    if (pRVar2 != (RefCntBuffer *)0x0) {
      pRVar2->ref_count = pRVar2->ref_count + -1;
    }
    (cpi->common).cur_frame = pRVar1;
    pRVar1->ref_count = pRVar1->ref_count + 1;
  }
  iVar4 = encode_show_existing_frame(cm);
  if (((iVar4 == 0) && (((cpi->common).seq_params)->film_grain_params_present != '\0')) &&
     (((cpi->common).show_frame != 0 || ((cpi->common).showable_frame != 0)))) {
    memcpy(&((cpi->common).cur_frame)->film_grain_params,&(cpi->common).film_grain_params,0x288);
    if ((cpi->common).current_frame.frame_type != '\x01') {
      (((cpi->common).cur_frame)->film_grain_params).update_parameters = 1;
    }
    uVar3 = (short)*(undefined4 *)&(cpi->common).film_grain_params.random_seed + 0xd35;
    uVar6 = 0x1cdf;
    if (uVar3 != 0) {
      uVar6 = uVar3;
    }
    (cpi->common).film_grain_params.random_seed = uVar6;
  }
  for (iVar4 = 0; iVar4 < (cpi->common).tiles.cols; iVar4 = iVar4 + 1) {
    for (iVar9 = 0; iVar9 < (cpi->common).tiles.rows; iVar9 = iVar9 + 1) {
      memcpy(&cpi->tile_data[(cpi->common).tiles.cols * iVar9 + iVar4].tctx,(cpi->common).fc,0x52fc)
      ;
    }
  }
  if ((((cm->current_frame).frame_type & 0xfd) != 0) &&
     ((cpi->common).features.interp_filter == MULTITAP_SHARP2)) {
    puVar5 = (uint *)(cpi->td).counts;
    count[2] = 0;
    count[0] = 0;
    count[1] = 0;
    iVar4 = 0;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      iVar9 = count[lVar7];
      for (lVar8 = -0xc0; lVar8 != 0; lVar8 = lVar8 + 0xc) {
        iVar9 = iVar9 + *(int *)((long)puVar5 + lVar8 + 0xc0);
      }
      count[lVar7] = iVar9;
      iVar4 = iVar4 + (uint)(0 < iVar9);
      puVar5 = puVar5 + 1;
    }
    if (iVar4 == 1) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        if (count[lVar7] != 0) {
          (cpi->common).features.interp_filter = (InterpFilter)lVar7;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_finalize_encoded_frame(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  if (!cm->seq_params->reduced_still_picture_hdr &&
      encode_show_existing_frame(cm)) {
    RefCntBuffer *const frame_to_show =
        cm->ref_frame_map[cpi->existing_fb_idx_to_show];

    if (frame_to_show == NULL) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    assert(frame_to_show->ref_count > 0);
    assign_frame_buffer_p(&cm->cur_frame, frame_to_show);
  }

  if (!encode_show_existing_frame(cm) &&
      cm->seq_params->film_grain_params_present &&
      (cm->show_frame || cm->showable_frame)) {
    // Copy the current frame's film grain params to the its corresponding
    // RefCntBuffer slot.
    cm->cur_frame->film_grain_params = cm->film_grain_params;

    // We must update the parameters if this is not an INTER_FRAME
    if (current_frame->frame_type != INTER_FRAME)
      cm->cur_frame->film_grain_params.update_parameters = 1;

    // Iterate the random seed for the next frame.
    cm->film_grain_params.random_seed += 3381;
    if (cm->film_grain_params.random_seed == 0)
      cm->film_grain_params.random_seed = 7391;
  }

  // Initialise all tiles' contexts from the global frame context
  for (int tile_col = 0; tile_col < cm->tiles.cols; tile_col++) {
    for (int tile_row = 0; tile_row < cm->tiles.rows; tile_row++) {
      const int tile_idx = tile_row * cm->tiles.cols + tile_col;
      cpi->tile_data[tile_idx].tctx = *cm->fc;
    }
  }

  if (!frame_is_intra_only(cm))
    fix_interp_filter(&cm->features.interp_filter, cpi->td.counts);
}